

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O2

bool wasm::
     CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::
     isReturnCall(Expression *curr)

{
  Id IVar1;
  Call *pCVar2;
  CallIndirect *pCVar3;
  CallRef *pCVar4;
  bool *pbVar5;
  
  IVar1 = curr->_id;
  if (IVar1 == CallRefId) {
    pCVar4 = Expression::cast<wasm::CallRef>(curr);
    pbVar5 = &pCVar4->isReturn;
  }
  else if (IVar1 == CallIndirectId) {
    pCVar3 = Expression::cast<wasm::CallIndirect>(curr);
    pbVar5 = &pCVar3->isReturn;
  }
  else {
    if (IVar1 != CallId) {
      handle_unreachable("not a call",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                         ,0x1d5);
    }
    pCVar2 = Expression::cast<wasm::Call>(curr);
    pbVar5 = &pCVar2->isReturn;
  }
  return *pbVar5;
}

Assistant:

static bool isReturnCall(Expression* curr) {
    switch (curr->_id) {
      case Expression::Id::CallId:
        return curr->cast<Call>()->isReturn;
      case Expression::Id::CallIndirectId:
        return curr->cast<CallIndirect>()->isReturn;
      case Expression::Id::CallRefId:
        return curr->cast<CallRef>()->isReturn;
      default:
        WASM_UNREACHABLE("not a call");
    }
  }